

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kats_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  picnic_params_t pVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  reference ppVar6;
  int in_EDI;
  int t_1;
  picnic_params_t s;
  iterator __end1;
  iterator __begin1;
  vector<picnic_params_t,_std::allocator<picnic_params_t>_> *__range1;
  int ret;
  int t;
  picnic_params_t param;
  char *in_stack_00000198;
  ostream *in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  ostream *in_stack_ffffffffffffff80;
  __normal_iterator<picnic_params_t_*,_std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>_>
  local_48;
  undefined1 local_40 [24];
  undefined1 *local_28;
  int local_1c;
  int local_18;
  picnic_params_t_conflict local_14;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 2) {
    local_14 = argument_to_params(in_stack_00000198);
    if (local_14 == PARAMETER_SET_INVALID) {
      poVar4 = std::operator<<((ostream *)&std::cout,"ERR: invalid test idx");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
    }
    else {
      local_18 = anon_unknown.dwarf_279e::run_test
                           ((picnic_params_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      if (local_18 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"ERR: Picnic KAT test ");
        pcVar5 = (char *)picnic_get_param_name(local_14);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4," FAILED");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_1c = 0;
    all_supported_parameters();
    local_28 = local_40;
    local_48._M_current =
         (picnic_params_t *)
         std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>::begin
                   ((vector<picnic_params_t,_std::allocator<picnic_params_t>_> *)
                    in_stack_ffffffffffffff68);
    std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>::end
              ((vector<picnic_params_t,_std::allocator<picnic_params_t>_> *)
               in_stack_ffffffffffffff68);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<picnic_params_t_*,_std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>_>
                          *)in_stack_ffffffffffffff70,
                         (__normal_iterator<picnic_params_t_*,_std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>_>
                          *)in_stack_ffffffffffffff68);
      if (!bVar2) break;
      ppVar6 = __gnu_cxx::
               __normal_iterator<picnic_params_t_*,_std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>_>
               ::operator*(&local_48);
      pVar1 = *ppVar6;
      iVar3 = anon_unknown.dwarf_279e::run_test
                        ((picnic_params_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      if (iVar3 == 0) {
        in_stack_ffffffffffffff80 = std::operator<<((ostream *)&std::cout,"ERR: Picnic KAT test ");
        pcVar5 = (char *)picnic_get_param_name(pVar1);
        in_stack_ffffffffffffff70 = std::operator<<(in_stack_ffffffffffffff80,pcVar5);
        in_stack_ffffffffffffff68 = std::operator<<(in_stack_ffffffffffffff70," FAILED");
        std::ostream::operator<<(in_stack_ffffffffffffff68,std::endl<char,std::char_traits<char>>);
        local_1c = -1;
      }
      __gnu_cxx::
      __normal_iterator<picnic_params_t_*,_std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>_>
      ::operator++(&local_48);
    }
    std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>::~vector
              ((vector<picnic_params_t,_std::allocator<picnic_params_t>_> *)
               in_stack_ffffffffffffff80);
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  if (argc == 2) {
    const picnic_params_t param = argument_to_params(argv[1]);
    if (param == PARAMETER_SET_INVALID) {
      std::cout << "ERR: invalid test idx" << std::endl;
      return 1;
    }

    const int t = run_test(param);
    if (!t) {
      std::cout << "ERR: Picnic KAT test " << picnic_get_param_name(param) << " FAILED"
                << std::endl;
      return -1;
    }
    return 0;
  }

  int ret = 0;
  for (const auto s : all_supported_parameters()) {
    const int t = run_test(s);
    if (!t) {
      std::cout << "ERR: Picnic KAT test " << picnic_get_param_name(s) << " FAILED" << std::endl;
      ret = -1;
    }
  }

  return ret;
}